

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SimpleParallelSimulationDataGenerator::Initialize
          (SimpleParallelSimulationDataGenerator *this,U32 simulation_sample_rate,
          SimpleParallelAnalyzerSettings *settings)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  pointer puVar3;
  iterator __position;
  iterator __position_00;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  ulong uVar6;
  int iVar7;
  U16 val;
  unsigned_short local_42;
  vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>> *local_40;
  SimulationChannelDescriptor *local_38;
  
  this->mSettings = settings;
  this->mSimulationSampleRateHz = simulation_sample_rate;
  ppSVar2 = (this->mData).
            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mData).
      super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    (this->mData).
    super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar2;
  }
  puVar3 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar3) {
    (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  uVar4 = (ulong)((long)(settings->mDataChannels).
                        super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(settings->mDataChannels).
                       super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar4 != 0) {
    local_40 = (vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>> *)
               &this->mData;
    iVar7 = 0;
    uVar6 = 0;
    do {
      local_38 = (SimulationChannelDescriptor *)
                 SimulationChannelDescriptorGroup::Add
                           ((Channel *)&this->mSimulationData,
                            (int)(this->mSettings->mDataChannels).
                                 super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                 super__Vector_impl_data._M_start + iVar7,
                            this->mSimulationSampleRateHz);
      __position._M_current =
           (this->mData).
           super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mData).
          super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>>::
        _M_realloc_insert<SimulationChannelDescriptor*>(local_40,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppSVar1 = &(this->mData).
                    super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      local_42 = (unsigned_short)(1 << ((byte)uVar6 & 0x1f));
      __position_00._M_current =
           (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->mDataMasks,
                   __position_00,&local_42);
      }
      else {
        *__position_00._M_current = local_42;
        (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + 0x10;
    } while ((uVar4 & 0xffffffff) != uVar6);
  }
  pSVar5 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mSimulationData,(int)this->mSettings + 0x28,
                      this->mSimulationSampleRateHz);
  this->mClock = pSVar5;
  this->mValue = 0;
  return;
}

Assistant:

void SimpleParallelSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SimpleParallelAnalyzerSettings* settings )
{
	mSettings = settings;
	mSimulationSampleRateHz = simulation_sample_rate;

	mData.clear();
	mDataMasks.clear();

	U32 count = (U32)mSettings->mDataChannels.size();
	for( U32 i=0; i<count; i++ )
	{
		mData.push_back( mSimulationData.Add( mSettings->mDataChannels[i], mSimulationSampleRateHz, BIT_LOW ) );
		U16 val = 1 << i;
		mDataMasks.push_back( val );
	}

	if( mSettings->mClockEdge == AnalyzerEnums::NegEdge )
		mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
	else
		mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );

	mValue = 0;
}